

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gillespie.cpp
# Opt level: O0

void __thiscall Gillespie::LinkReaction(Gillespie *this,Ptr *reaction)

{
  bool bVar1;
  element_type *peVar2;
  size_type sVar3;
  double extraout_XMM0_Qa;
  double local_40;
  double new_prop;
  shared_ptr<Reaction> *local_30;
  __normal_iterator<std::shared_ptr<Reaction>_*,_std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>_>
  local_28;
  __normal_iterator<std::shared_ptr<Reaction>_*,_std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>_>
  local_20;
  __normal_iterator<std::shared_ptr<Reaction>_*,_std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>_>
  it;
  Ptr *reaction_local;
  Gillespie *this_local;
  
  it._M_current = reaction;
  local_28._M_current =
       (shared_ptr<Reaction> *)
       std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>::begin
                 (&this->reactions_);
  local_30 = (shared_ptr<Reaction> *)
             std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>::
             end(&this->reactions_);
  local_20 = std::
             find<__gnu_cxx::__normal_iterator<std::shared_ptr<Reaction>*,std::vector<std::shared_ptr<Reaction>,std::allocator<std::shared_ptr<Reaction>>>>,std::shared_ptr<Reaction>>
                       (local_28,(__normal_iterator<std::shared_ptr<Reaction>_*,_std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>_>
                                  )local_30,reaction);
  new_prop = (double)std::
                     vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>
                     ::end(&this->reactions_);
  bVar1 = __gnu_cxx::operator==
                    (&local_20,
                     (__normal_iterator<std::shared_ptr<Reaction>_*,_std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>_>
                      *)&new_prop);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<Reaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Reaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        reaction);
    sVar3 = std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>::
            size(&this->reactions_);
    (*peVar2->_vptr_Reaction[3])(peVar2,sVar3 & 0xffffffff);
    peVar2 = std::__shared_ptr_access<Reaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Reaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        reaction);
    (**peVar2->_vptr_Reaction)();
    local_40 = extraout_XMM0_Qa;
    std::vector<double,_std::allocator<double>_>::push_back(&this->alpha_list_,&local_40);
    this->alpha_sum_ = local_40 + this->alpha_sum_;
    std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>::push_back
              (&this->reactions_,reaction);
  }
  return;
}

Assistant:

void Gillespie::LinkReaction(Reaction::Ptr reaction) {
  auto it = std::find(reactions_.begin(), reactions_.end(), reaction);
  if (it == reactions_.end()) {
    reaction->index(reactions_.size());
    double new_prop = reaction->CalculatePropensity();
    alpha_list_.push_back(new_prop);
    alpha_sum_ += new_prop;
    reactions_.push_back(reaction);
  }
}